

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  uint32_t *puVar1;
  uint32_t type_id;
  mapped_type mVar2;
  _Manager_type p_Var3;
  __node_base_ptr p_Var4;
  __node_ptr p_Var5;
  uint16_t uVar6;
  undefined4 endian;
  spv_operand_type_t sVar7;
  bool bVar8;
  spv_result_t sVar9;
  Op OVar10;
  spv_operand_type_t sVar11;
  Op OVar12;
  spv_ext_inst_type_t sVar13;
  int32_t iVar14;
  uint32_t uVar15;
  spv_result_t sVar16;
  DiagnosticStream *pDVar17;
  undefined8 uVar18;
  Op *pOVar19;
  mapped_type *pmVar20;
  _Hash_node_base *p_Var21;
  __node_base_ptr p_Var22;
  mapped_type *pmVar23;
  __node_ptr p_Var24;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var25;
  uint uVar26;
  __hash_code __c;
  __node_base _Var27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  size_type __n;
  ulong uVar31;
  ushort uVar32;
  uint uVar33;
  int iVar34;
  uint32_t *inst_offset;
  char *pcVar35;
  __node_base_ptr p_Var36;
  Op OVar37;
  long lVar38;
  Op *pOVar39;
  bool bVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  spv_operand_desc entry;
  spv_opcode_desc opcode_desc;
  uint32_t first_word;
  spv_parsed_instruction_t inst;
  Parser parser;
  spv_context_t hijack_context;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_2;
  uint16_t local_49a;
  uint32_t *local_498;
  ulong local_490;
  Op local_488;
  spv_parsed_operand_t local_484;
  uint local_474;
  spv_ext_inst_desc local_470;
  ulong local_468;
  undefined1 local_460 [32];
  spv_opcode_desc local_440;
  char *local_438;
  spv_operand_type_t local_42c;
  spv_parsed_instruction_t local_428;
  Op *local_3f8;
  undefined1 local_3f0 [112];
  __buckets_ptr local_380;
  ulong local_378;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_348;
  __buckets_ptr local_310;
  ulong local_308;
  spv_parsed_operand_t *local_2d8;
  iterator local_2d0;
  spv_parsed_operand_t *local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  spv_operand_pattern_t local_2a8;
  long local_290;
  uint32_t *local_288;
  Op *local_280;
  spv_context_t local_278;
  spv_header_t local_238;
  spv_const_binary_t local_218;
  DiagnosticStream local_208;
  
  local_278.target_env = context->target_env;
  local_278._4_4_ = *(undefined4 *)&context->field_0x4;
  local_278.opcode_table = context->opcode_table;
  local_278.operand_table = context->operand_table;
  local_278.ext_inst_table = context->ext_inst_table;
  local_278.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_278.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_278.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_278.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var3 = (context->consumer).super__Function_base._M_manager;
  local_498 = code;
  local_460._16_8_ = num_words;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&local_278.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_278.consumer._M_invoker = (context->consumer)._M_invoker;
    local_278.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
  }
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_278,diagnostic);
  }
  local_3f0._0_4_ = local_278.target_env;
  local_3f0._8_8_ = local_278.operand_table;
  local_3f0._16_8_ = local_278.opcode_table;
  local_3f0._24_8_ = local_278.ext_inst_table;
  local_3f0._32_8_ = &local_278.consumer;
  local_3f0._40_8_ = user_data;
  local_3f0._48_8_ = parsed_header;
  local_3f0._56_8_ = parsed_instruction;
  anon_unknown.dwarf_2a62de0::Parser::State::State
            ((State *)(local_3f0 + 0x40),(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_2a62de0::Parser::State::State
            ((State *)&local_208,local_498,local_460._16_8_,diagnostic);
  anon_unknown.dwarf_2a62de0::Parser::State::operator=
            ((State *)(local_3f0 + 0x40),(State *)&local_208);
  anon_unknown.dwarf_2a62de0::Parser::State::~State((State *)&local_208);
  if ((uint32_t *)local_3f0._64_8_ == (uint32_t *)0x0) {
    anon_unknown.dwarf_2a62de0::Parser::diagnostic
              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
    pcVar35 = "Missing module.";
    lVar28 = 0xf;
LAB_00623296:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar35,lVar28);
  }
  else {
    if ((uint32_t *)0x4 < (ulong)local_3f0._72_8_) {
      local_218.code = (uint32_t *)local_3f0._64_8_;
      local_218.wordCount = local_3f0._72_8_;
      sVar9 = spvBinaryEndianness(&local_218,(spv_endianness_t *)(local_3f0 + 0x68));
      if (sVar9 == SPV_SUCCESS) {
        bVar8 = spvIsHostEndian(local_3f0._104_4_);
        local_3f0[0x6c] = !bVar8;
        sVar9 = spvBinaryHeaderGet(&local_218,local_3f0._104_4_,&local_238);
        if (sVar9 == SPV_SUCCESS) {
          if ((spv_parsed_header_fn_t)local_3f0._48_8_ == (spv_parsed_header_fn_t)0x0) {
LAB_0062343f:
            local_3f0._88_8_ = (uint32_t *)0x5;
LAB_00623462:
            if ((ulong)local_3f0._88_8_ < (ulong)local_3f0._72_8_) {
              local_3f0._96_8_ = local_3f0._96_8_ + 1;
              local_428.type_id = 0;
              local_428.result_id = 0;
              local_428.operands = (spv_parsed_operand_t *)0x0;
              local_428.words = (uint *)0x0;
              local_428.num_words = 0;
              local_428.opcode = 0;
              local_428.ext_inst_type = SPV_EXT_INST_TYPE_NONE;
              local_428.num_operands = 0;
              local_428._34_6_ = 0;
              local_42c = anon_unknown.dwarf_2a62de0::Parser::peekAt
                                    ((Parser *)local_3f0,local_3f0._88_8_);
              if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2c0,
                           (iterator)
                           local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_42c);
              }
              else {
                *local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_42c;
                local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_2d0._M_current != local_2d8) {
                local_2d0._M_current = local_2d8;
              }
              if ((ulong)local_3f0._72_8_ <= (ulong)local_3f0._88_8_) {
                __assert_fail("_.word_index < _.num_words",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                              ,0x138,
                              "spv_result_t (anonymous namespace)::Parser::parseInstruction()");
              }
              local_49a = 0;
              spvOpcodeSplit(local_42c,&local_49a,&local_428.opcode);
              if (local_49a == 0) {
                anon_unknown.dwarf_2a62de0::Parser::diagnostic
                          (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid instruction word count: ",0x20);
LAB_006235d5:
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                OVar10 = local_208.error_;
LAB_006235e7:
                user_data = (void *)(ulong)OVar10;
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
              }
              else {
                sVar9 = spvtools::AssemblyGrammar::lookupOpcode
                                  ((AssemblyGrammar *)local_3f0,(uint)local_428.opcode,&local_440);
                if (sVar9 != SPV_SUCCESS) {
                  anon_unknown.dwarf_2a62de0::Parser::diagnostic
                            (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid opcode: ",0x10);
                  goto LAB_006235d5;
                }
                local_498 = (uint32_t *)local_3f0._88_8_;
                local_3f0._88_8_ = local_3f0._88_8_ + 1;
                if (local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  local_2a8.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                }
                uVar26 = (uint)local_440->numTypes;
                local_288 = (uint32_t *)local_3f0._88_8_;
                if (local_440->numTypes != 0) {
                  uVar33 = 0;
                  user_data = (spv_parsed_header_fn_t)0xffffffff;
                  do {
                    if (local_2a8.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_2a8.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                      _M_realloc_insert<spv_operand_type_t_const&>
                                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                                 &local_2a8,
                                 (iterator)
                                 local_2a8.
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 local_440->operandTypes + (int)(uVar26 + (int)user_data));
                    }
                    else {
                      *local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           local_440->operandTypes[(int)(uVar26 + (int)user_data)];
                      local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_2a8.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar33 = uVar33 + 1;
                    uVar26 = (uint)local_440->numTypes;
                    user_data = (void *)(ulong)((int)user_data - 1);
                  } while (uVar33 < uVar26);
                }
                local_474 = (uint)parsed_header;
                inst_offset = local_498;
                do {
                  OVar10 = (Op)user_data;
                  if ((uint32_t *)((ulong)local_49a + (long)inst_offset) <= (ulong)local_3f0._88_8_)
                  {
                    if ((local_2a8.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         local_2a8.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
                       (bVar8 = spvOperandIsOptional
                                          (local_2a8.
                                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish[-1]), bVar8))
                    {
                      if ((uint32_t *)((long)inst_offset + (ulong)local_49a) ==
                          (uint32_t *)local_3f0._88_8_) {
                        __c = (long)local_2c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                        local_460._16_4_ = OVar10;
                        if ((bool)local_3f0[0x6c] == true) {
                          __c = (long)__c >> 2;
                          if (__c != local_49a) {
                            __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                          ,0x180,
                                          "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                         );
                          }
                        }
                        else if (__c != 4) {
                          __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                        ,0x182,
                                        "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                       );
                        }
                        uVar6 = local_428.opcode;
                        OVar10 = (Op)local_428.opcode;
                        iVar14 = spvOpcodeGeneratesType(OVar10);
                        puVar1 = local_498;
                        if (iVar14 == 0) goto LAB_00624c3b;
                        if (OVar10 == OpTypeFloat) {
                          iVar34 = 3;
LAB_00624a06:
                          sVar11 = anon_unknown.dwarf_2a62de0::Parser::peekAt
                                             ((Parser *)local_3f0,(long)puVar1 + 2);
                        }
                        else {
                          iVar34 = 0;
                          sVar11 = SPV_OPERAND_TYPE_NONE;
                          if (uVar6 == 0x15) {
                            uVar15 = anon_unknown.dwarf_2a62de0::Parser::peekAt
                                               ((Parser *)local_3f0,(long)local_498 + 3);
                            iVar34 = 2 - (uint)(uVar15 == 0);
                            goto LAB_00624a06;
                          }
                        }
                        uVar29 = (ulong)local_428._16_8_ >> 0x20;
                        uVar30 = uVar29 % local_348._M_bucket_count;
                        p_Var24 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::_M_find_node(&local_348,uVar30,&local_428.result_id,__c);
                        if (p_Var24 != (__node_ptr)0x0) goto LAB_00624c27;
                        p_Var24 = (__node_ptr)operator_new(0x18);
                        (p_Var24->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
                        (p_Var24->
                        super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                        ._M_storage._M_storage.__align =
                             (anon_struct_4_0_00000001_for___align)local_428.result_id;
                        *(undefined8 *)
                         ((long)&(p_Var24->
                                 super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                                 ._M_storage._M_storage + 4) = 0;
                        auVar42 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                            ((ulong)&local_348._M_rehash_policy,
                                             local_348._M_bucket_count,local_348._M_element_count);
                        __n = auVar42._8_8_;
                        if ((auVar42 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                        goto LAB_00624ba4;
                        local_460._24_4_ = sVar11;
                        if (__n == 1) {
                          local_348._M_single_bucket = (__node_base_ptr)0x0;
                          __s = &local_348._M_single_bucket;
                        }
                        else {
                          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                          ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                           &local_208,__n,(void *)0x0);
                          memset(__s,0,__n * 8);
                        }
                        _Var27._M_nxt = local_348._M_before_begin._M_nxt;
                        local_348._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                        if ((__node_ptr)_Var27._M_nxt == (__node_ptr)0x0) goto LAB_00624b5f;
                        uVar30 = 0;
                        goto LAB_00624afb;
                      }
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid word count: Op",0x16);
                      pDVar17 = spvtools::DiagnosticStream::operator<<(&local_208,&local_440->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," says it has ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," words, but found ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      lVar28 = 0xf;
                      pcVar35 = " words instead.";
                    }
                    else {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"End of input reached while decoding Op",0x26
                                );
                      pDVar17 = spvtools::DiagnosticStream::operator<<(&local_208,&local_440->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17,": expected more operands after ",0x1f);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      lVar28 = 7;
                      pcVar35 = " words.";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar17,pcVar35,lVar28);
                    OVar10 = pDVar17->error_;
                    goto LAB_006235e7;
                  }
                  if (local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    anon_unknown.dwarf_2a62de0::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid instruction Op",0x16);
                    pDVar17 = spvtools::DiagnosticStream::operator<<(&local_208,&local_440->name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar17," starting at word ",0x12);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar17,": expected no more operands after ",0x22);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar17," words, but stated word count is ",0x21);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,".",1);
                    inst_offset = local_498;
                    OVar12 = pDVar17->error_;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    bVar8 = false;
                    goto LAB_006242a7;
                  }
                  sVar11 = spvTakeFirstMatchableOperand(&local_2a8);
                  uVar29 = (ulong)sVar11;
                  OVar12 = (Op)local_428.opcode;
                  local_484.offset = (short)local_3f0._88_8_ - (short)inst_offset;
                  local_484.num_words = 1;
                  local_484.number_kind = SPV_NUMBER_NONE;
                  local_484.number_bit_width = 0;
                  local_460._16_4_ = OVar10;
                  local_484.type = sVar11;
                  if ((ulong)local_3f0._72_8_ <= (ulong)local_3f0._88_8_) goto LAB_00623908;
                  local_488 = (Op)local_428.opcode;
                  OVar12 = anon_unknown.dwarf_2a62de0::Parser::peekAt
                                     ((Parser *)local_3f0,local_3f0._88_8_);
                  local_490 = CONCAT44(local_490._4_4_,OVar12);
                  local_460._24_8_ = uVar29;
                  switch(sVar11) {
                  case SPV_OPERAND_TYPE_ID:
                  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                    if (OVar12 == OpNop) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar28 = 7;
                      pcVar35 = "Id is 0";
LAB_006243dd:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar35,lVar28);
                      OVar10 = local_208.error_;
                      goto LAB_006243f1;
                    }
                    local_484.type = SPV_OPERAND_TYPE_ID;
                    bVar8 = spvIsExtendedInstruction(local_488);
                    if ((!bVar8) || (local_484.offset != 3)) break;
                    uVar29 = (local_490 & 0xffffffff) % local_308;
                    p_Var4 = local_310[uVar29];
                    p_Var22 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var36 = p_Var4->_M_nxt, p_Var22 = p_Var4,
                       (Op)local_490 != *(Op *)&p_Var36[1]._M_nxt)) {
                      while (p_Var21 = p_Var36->_M_nxt, p_Var21 != (_Hash_node_base *)0x0) {
                        p_Var22 = (__node_base_ptr)0x0;
                        if (((ulong)*(Op *)&p_Var21[1]._M_nxt % local_308 != uVar29) ||
                           (p_Var22 = p_Var36, p_Var36 = p_Var21,
                           (Op)local_490 == *(Op *)&p_Var21[1]._M_nxt)) goto LAB_006246c0;
                      }
                      p_Var22 = (__node_base_ptr)0x0;
                    }
LAB_006246c0:
                    if (p_Var22 == (__node_base_ptr)0x0) {
                      p_Var21 = (_Hash_node_base *)0x0;
                    }
                    else {
                      p_Var21 = p_Var22->_M_nxt;
                    }
                    if (p_Var21 == (_Hash_node_base *)0x0) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"OpExtInst set Id ",0x11);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,
                                 " does not reference an OpExtInstImport result Id",0x30);
                      OVar10 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    }
                    else {
                      local_428.ext_inst_type =
                           *(spv_ext_inst_type_t *)((long)&p_Var21[1]._M_nxt + 4);
                      OVar10 = (Op)local_490;
                    }
                    bVar8 = p_Var21 == (_Hash_node_base *)0x0;
                    goto LAB_0062473a;
                  case SPV_OPERAND_TYPE_TYPE_ID:
                    if (OVar12 == OpNop) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar28 = 0x13;
                      pcVar35 = "Error: Type Id is 0";
                      goto LAB_006243dd;
                    }
                    local_428.type_id = OVar12;
                    break;
                  case SPV_OPERAND_TYPE_RESULT_ID:
                    if (OVar12 == OpNop) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar28 = 0x15;
                      pcVar35 = "Error: Result Id is 0";
                      goto LAB_006243dd;
                    }
                    local_428.result_id = OVar12;
                    p_Var4 = local_380[(ulong)OVar12 % local_378];
                    p_Var22 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var36 = p_Var4->_M_nxt, p_Var22 = p_Var4,
                       OVar12 != *(Op *)&p_Var36[1]._M_nxt)) {
                      while (p_Var21 = p_Var36->_M_nxt, p_Var21 != (_Hash_node_base *)0x0) {
                        p_Var22 = (__node_base_ptr)0x0;
                        if (((ulong)*(Op *)&p_Var21[1]._M_nxt % local_378 !=
                             (ulong)OVar12 % local_378) ||
                           (p_Var22 = p_Var36, p_Var36 = p_Var21,
                           OVar12 == *(Op *)&p_Var21[1]._M_nxt)) goto LAB_0062474c;
                      }
                      p_Var22 = (__node_base_ptr)0x0;
                    }
LAB_0062474c:
                    if ((p_Var22 != (__node_base_ptr)0x0) &&
                       (p_Var22->_M_nxt != (_Hash_node_base *)0x0)) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Id ",3);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208," is defined more than once",0x1a);
                      OVar10 = local_208.error_;
                      goto LAB_006247ad;
                    }
                    iVar14 = spvOpcodeGeneratesType(local_488);
                    mVar2 = (&local_428.type_id)[iVar14 != 0];
                    pmVar23 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)&local_380,&local_428.result_id);
                    *pmVar23 = mVar2;
                    inst_offset = local_498;
                    break;
                  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                  case SPV_OPERAND_TYPE_SCOPE_ID:
                    if (OVar12 == OpNop) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      local_470 = (spv_ext_inst_desc)spvOperandTypeStr(sVar11);
                      pDVar17 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_470);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," is 0",5);
                      OVar10 = pDVar17->error_;
                      goto LAB_006243f1;
                    }
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                    uVar18 = 0x100000006;
                    goto LAB_00623ee4;
                  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                    bVar8 = spvIsExtendedInstruction(local_488);
                    if (!bVar8) {
                      __assert_fail("spvIsExtendedInstruction(opcode)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f1,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (local_428.ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
                      __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f2,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar9 = spvtools::AssemblyGrammar::lookupExtInst
                                      ((AssemblyGrammar *)local_3f0,local_428.ext_inst_type,
                                       (Op)local_490,&local_470);
                    if (sVar9 == SPV_SUCCESS) {
                      spvPushOperandTypes(local_470->operandTypes,&local_2a8);
LAB_006244d3:
                      bVar8 = true;
                    }
                    else {
                      bVar8 = spvExtInstIsNonSemantic(local_428.ext_inst_type);
                      if (bVar8) {
                        local_208._0_4_ = 0x34;
                        if (local_2a8.
                            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish ==
                            local_2a8.
                            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                          _M_realloc_insert<spv_operand_type_t>
                                    (&local_2a8,
                                     (iterator)
                                     local_2a8.
                                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     (spv_operand_type_t *)&local_208);
                        }
                        else {
                          *local_2a8.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish =
                               SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
                          local_2a8.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               local_2a8.
                               super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        goto LAB_006244d3;
                      }
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid extended instruction number: ",0x25)
                      ;
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      OVar10 = local_208.error_;
                      inst_offset = local_498;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      bVar8 = false;
                    }
                    if (bVar8) break;
                    goto LAB_00624299;
                  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                    if (local_488 != OpSpecConstantOp) {
                      __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x207,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (((int)OVar12 < 0) ||
                       (sVar9 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                          ((AssemblyGrammar *)local_3f0,OVar12),
                       sVar9 != SPV_SUCCESS)) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_470 = (spv_ext_inst_desc)spvOperandTypeStr(sVar11);
                      pDVar17 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_470);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar17,": ",2);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      OVar10 = pDVar17->error_;
LAB_006247ad:
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      inst_offset = local_498;
                      goto LAB_00624299;
                    }
                    local_470 = (spv_ext_inst_desc)0x0;
                    OVar37 = spvtools::AssemblyGrammar::lookupOpcode
                                       ((AssemblyGrammar *)local_3f0,OVar12,
                                        (spv_opcode_desc *)&local_470);
                    if (OVar37 == OpNop) {
                      if (*(byte *)((long)local_470->operandTypes + 0x55) == 0) {
                        __assert_fail("opcode_entry->hasType",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x215,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((char)local_470->operandTypes[0x15] == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("opcode_entry->hasResult",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x216,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((ushort)(short)local_470->operandTypes[4] < SPV_OPERAND_TYPE_TYPE_ID) {
                        __assert_fail("opcode_entry->numTypes >= 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x217,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      spvPushOperandTypes(local_470->operandTypes + 7,&local_2a8);
                      inst_offset = local_498;
                    }
                    else {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INTERNAL);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"OpSpecConstant opcode table out of sync",
                                 0x27);
                      OVar10 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      inst_offset = local_498;
                    }
                    goto joined_r0x00624170;
                  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                    local_484.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                    if ((local_488 == OpConstant) || (local_488 == OpSpecConstant)) {
                      if (local_428.type_id == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("inst->type_id",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                      ,0x24d,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      OVar10 = anon_unknown.dwarf_2a62de0::Parser::setNumericTypeInfoForType
                                         ((Parser *)local_3f0,&local_484,local_428.type_id);
                      OVar37 = OVar10;
                      goto joined_r0x00624170;
                    }
                    if (local_488 != OpSwitch) {
                      __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                    ,0x24a,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    uVar15 = anon_unknown.dwarf_2a62de0::Parser::peekAt
                                       ((Parser *)local_3f0,(size_t)local_288);
                    p_Var4 = local_380[(ulong)uVar15 % local_378];
                    p_Var22 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var36 = p_Var4->_M_nxt, p_Var22 = p_Var4,
                       uVar15 != *(uint32_t *)&p_Var36[1]._M_nxt)) {
                      while (p_Var21 = p_Var36->_M_nxt, p_Var21 != (_Hash_node_base *)0x0) {
                        p_Var22 = (__node_base_ptr)0x0;
                        if (((ulong)*(uint *)&p_Var21[1]._M_nxt % local_378 !=
                             (ulong)uVar15 % local_378) ||
                           (p_Var22 = p_Var36, p_Var36 = p_Var21,
                           uVar15 == *(uint *)&p_Var21[1]._M_nxt)) goto LAB_00624587;
                      }
                      p_Var22 = (__node_base_ptr)0x0;
                    }
LAB_00624587:
                    if (p_Var22 == (__node_base_ptr)0x0) {
                      p_Var21 = (_Hash_node_base *)0x0;
                    }
                    else {
                      p_Var21 = p_Var22->_M_nxt;
                    }
                    if ((p_Var21 == (_Hash_node_base *)0x0) ||
                       (type_id = *(uint32_t *)((long)&p_Var21[1]._M_nxt + 4), type_id == 0)) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      lVar28 = 0xc;
                      pcVar35 = " has no type";
LAB_00624635:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar35,lVar28);
                      OVar10 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
LAB_00624649:
                      bVar8 = false;
                    }
                    else {
                      if (uVar15 == type_id) {
                        anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar28 = 0x17;
                        pcVar35 = " is a type, not a value";
                        goto LAB_00624635;
                      }
                      OVar10 = anon_unknown.dwarf_2a62de0::Parser::setNumericTypeInfoForType
                                         ((Parser *)local_3f0,&local_484,type_id);
                      if (OVar10 != OpNop) goto LAB_00624649;
                      bVar8 = true;
                      if (local_484.number_kind - SPV_NUMBER_FLOATING < 0xfffffffe) {
                        anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar28 = 0x18;
                        pcVar35 = " is not a scalar integer";
                        goto LAB_00624635;
                      }
                    }
                    bVar8 = !bVar8;
LAB_0062473a:
                    inst_offset = local_498;
                    if (!bVar8) break;
                    goto LAB_00624299;
                  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                    uVar18 = 0x30000000a;
LAB_00623ee4:
                    local_484.type = (spv_operand_type_t)uVar18;
                    local_484.number_kind = (spv_number_kind_t)((ulong)uVar18 >> 0x20);
                    local_484.number_bit_width = 0x20;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_STRING:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                    local_470 = (spv_ext_inst_desc)local_460;
                    local_468 = 0;
                    local_460[0] = 0;
                    local_290 = local_3f0._72_8_ - local_3f0._88_8_;
                    bVar41 = local_290 == 0;
                    if (!(bool)bVar41) {
                      local_280 = (Op *)(local_3f0._64_8_ + local_3f0._72_8_ * 4);
                      pOVar19 = (Op *)(local_3f0._64_8_ + local_3f0._88_8_ * 4);
                      bVar8 = false;
                      local_490 = 0;
                      do {
                        OVar10 = *pOVar19;
                        bVar41 = 0;
                        bVar40 = false;
                        pOVar39 = (Op *)0x0;
                        local_3f8 = pOVar19;
                        do {
                          if ((char)(OVar10 >> (bVar41 & 0x1f)) == '\0') {
                            local_490 = CONCAT71((int7)((ulong)pOVar19 >> 8),1);
                            break;
                          }
                          std::__cxx11::string::push_back((char)&local_470);
                          bVar40 = (Op *)0x2 < pOVar39;
                          pOVar19 = (Op *)((long)pOVar39 + 1);
                          bVar41 = bVar41 + 8;
                          pOVar39 = pOVar19;
                        } while (pOVar19 != (Op *)0x4);
                        if (!bVar40) break;
                        pOVar19 = local_3f8 + 1;
                        bVar8 = pOVar19 == local_280;
                      } while (!bVar8);
                      bVar41 = bVar8 | (byte)local_490;
                      parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
                      sVar11 = (spv_operand_type_t)local_460._24_8_;
                      inst_offset = local_498;
                    }
                    if (((bVar41 & 1) == 0) && (local_470 != (spv_ext_inst_desc)local_460)) {
                      operator_delete(local_470,CONCAT71(local_460._1_7_,local_460[0]) + 1);
                    }
                    if (local_468 == local_290 << 2) {
                      OVar10 = anon_unknown.dwarf_2a62de0::Parser::exhaustedInputDiagnostic
                                         ((Parser *)local_3f0,(size_t)inst_offset,local_488,sVar11);
                      bVar8 = false;
                    }
                    else {
                      uVar32 = (short)(local_468 >> 2) + 1;
                      if (local_468 < 0x3fffc) {
                        local_484.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                        bVar8 = true;
                        inst_offset = local_498;
                        local_484.num_words = uVar32;
                        if (local_488 == OpExtInstImport) {
                          sVar13 = spvExtInstImportTypeGet((char *)local_470);
                          if (sVar13 == SPV_EXT_INST_TYPE_NONE) {
                            anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                      (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,
                                       "Invalid extended instruction import \'",0x25);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,(char *)local_470,local_468);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"\'",1);
                            goto LAB_00624356;
                          }
                          if (local_428.result_id == SPV_OPERAND_TYPE_NONE) {
                            __assert_fail("inst->result_id",
                                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                          ,0x276,
                                          "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                         );
                          }
                          pmVar20 = std::__detail::
                                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_310,&local_428.result_id);
                          *pmVar20 = sVar13;
                          inst_offset = local_498;
                        }
                      }
                      else {
                        anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Literal string is longer than ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words: ",8);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words long",0xb);
LAB_00624356:
                        OVar10 = local_208.error_;
                        spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                        bVar8 = false;
                        inst_offset = local_498;
                      }
                    }
                    if (local_470 != (spv_ext_inst_desc)local_460) {
                      operator_delete(local_470,CONCAT71(local_460._1_7_,local_460[0]) + 1);
                    }
                    if (!bVar8) goto LAB_00624299;
                    break;
                  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                    OVar37 = spvtools::AssemblyGrammar::lookupOperand
                                       ((AssemblyGrammar *)local_3f0,sVar11,OVar12,
                                        (spv_operand_desc *)&local_470);
                    if (OVar37 != OpNop) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_438 = spvOperandTypeStr(local_484.type);
                      pDVar17 = spvtools::DiagnosticStream::operator<<(&local_208,&local_438);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," operand: ",10);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17,
                                 ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                                 ,0x82);
LAB_0062380d:
                      inst_offset = local_498;
                      OVar10 = pDVar17->error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      goto joined_r0x00624170;
                    }
                    goto LAB_0062415c;
                  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
                  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
                  case SPV_OPERAND_TYPE_MEMORY_MODEL:
                  case SPV_OPERAND_TYPE_EXECUTION_MODE:
                  case SPV_OPERAND_TYPE_STORAGE_CLASS:
                  case SPV_OPERAND_TYPE_DIMENSIONALITY:
                  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
                  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
                  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
                  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
                  case SPV_OPERAND_TYPE_DECORATION:
                  case SPV_OPERAND_TYPE_BUILT_IN:
                  case SPV_OPERAND_TYPE_GROUP_OPERATION:
                  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
                  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
                  case SPV_OPERAND_TYPE_CAPABILITY:
                  case SPV_OPERAND_TYPE_FPENCODING:
                  case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
                  case SPV_OPERAND_TYPE_FPDENORM_MODE:
                  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
                  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
                  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
                  case SPV_OPERAND_TYPE_RAY_FLAGS:
                  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
                  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
                    if (sVar11 == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                      local_484.type = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
LAB_00623776:
                      if (sVar11 == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) {
                        local_484.type = SPV_OPERAND_TYPE_FPENCODING;
                      }
                    }
                    else {
                      if (sVar11 != SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) goto LAB_00623776;
                      local_484.type = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
                    }
                    OVar37 = spvtools::AssemblyGrammar::lookupOperand
                                       ((AssemblyGrammar *)local_3f0,sVar11,OVar12,
                                        (spv_operand_desc *)&local_470);
                    if (OVar37 != OpNop) {
                      anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_438 = spvOperandTypeStr(local_484.type);
                      pDVar17 = spvtools::DiagnosticStream::operator<<(&local_208,&local_438);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar17," operand: ",10);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                      goto LAB_0062380d;
                    }
LAB_0062415c:
                    spvPushOperandTypes(local_470->operandTypes + 8,&local_2a8);
                    OVar10 = OVar12;
joined_r0x00624170:
                    if (OVar37 == OpNop) break;
                    goto LAB_00624299;
                  default:
                    anon_unknown.dwarf_2a62de0::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Internal error: Unhandled operand type: ",0x28
                              );
                    std::ostream::operator<<(&local_208,sVar11);
                    OVar10 = local_208.error_;
LAB_006243f1:
                    inst_offset = local_498;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    goto LAB_00624299;
                  case SPV_OPERAND_TYPE_IMAGE:
                  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                  case SPV_OPERAND_TYPE_LOOP_CONTROL:
                  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
                  case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
                  case SPV_OPERAND_TYPE_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS:
                    if ((int)sVar11 < 0x4e) {
                      sVar7 = SPV_OPERAND_TYPE_IMAGE;
                      if ((sVar11 != SPV_OPERAND_TYPE_OPTIONAL_IMAGE) &&
                         (sVar7 = local_484.type, sVar11 == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS)
                         ) {
                        sVar7 = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                      }
                    }
                    else if (sVar11 == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                      sVar7 = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                    }
                    else if (sVar11 == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                      sVar7 = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                    }
                    else {
                      sVar7 = local_484.type;
                      if (sVar11 == SPV_OPERAND_TYPE_OPTIONAL_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS) {
                        sVar7 = SPV_OPERAND_TYPE_MATRIX_MULTIPLY_ACCUMULATE_OPERANDS;
                      }
                    }
                    local_484.type = sVar7;
                    bVar8 = OVar12 == OpNop;
                    if (!bVar8) {
                      local_3f8 = (Op *)(ulong)OVar12;
                      OVar37 = ~Max;
                      do {
                        if ((OVar37 & OVar12) != OpNop) {
                          sVar9 = spvtools::AssemblyGrammar::lookupOperand
                                            ((AssemblyGrammar *)local_3f0,(spv_operand_type_t)uVar29
                                             ,OVar37,(spv_operand_desc *)&local_470);
                          if (sVar9 == SPV_SUCCESS) {
                            OVar12 = OVar12 ^ OVar37;
                            spvPushOperandTypes(local_470->operandTypes + 8,&local_2a8);
                          }
                          else {
                            anon_unknown.dwarf_2a62de0::Parser::diagnostic
                                      (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"Invalid ",8);
                            local_438 = spvOperandTypeStr(local_484.type);
                            pDVar17 = spvtools::DiagnosticStream::operator<<(&local_208,&local_438);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar17," operand: ",10);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar17," has invalid mask component ",0x1c);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar17);
                            uVar29 = local_460._24_8_;
                            user_data = (void *)(ulong)(uint)pDVar17->error_;
                            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                          }
                          OVar10 = (Op)user_data;
                          sVar11 = (spv_operand_type_t)uVar29;
                          if (sVar9 != SPV_SUCCESS) break;
                        }
                        OVar10 = (Op)user_data;
                        sVar11 = (spv_operand_type_t)uVar29;
                        OVar37 = OVar37 >> 1;
                        bVar8 = OVar12 == OpNop;
                      } while (!bVar8);
                    }
                    inst_offset = local_498;
                    parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
                    if (!bVar8) goto LAB_00624299;
                    if (((Op)local_490 == 0) &&
                       (sVar9 = spvtools::AssemblyGrammar::lookupOperand
                                          ((AssemblyGrammar *)local_3f0,sVar11,0,
                                           (spv_operand_desc *)&local_208), sVar9 == SPV_SUCCESS)) {
                      spvPushOperandTypes((spv_operand_type_t *)
                                          (CONCAT44(local_208._4_4_,local_208._0_4_) + 0x38),
                                          &local_2a8);
                    }
                  }
                  bVar8 = spvOperandIsConcrete(local_484.type);
                  if (!bVar8) {
                    __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                                  ,0x30c,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  if (local_2d0._M_current == local_2c8) {
                    std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
                    _M_realloc_insert<spv_parsed_operand_t_const&>
                              ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>> *)
                               &local_2d8,local_2d0,&local_484);
                  }
                  else {
                    (local_2d0._M_current)->offset = local_484.offset;
                    (local_2d0._M_current)->num_words = local_484.num_words;
                    (local_2d0._M_current)->type = local_484.type;
                    (local_2d0._M_current)->number_kind = local_484.number_kind;
                    (local_2d0._M_current)->number_bit_width = local_484.number_bit_width;
                    local_2d0._M_current = local_2d0._M_current + 1;
                  }
                  endian = local_3f0._104_4_;
                  uVar18 = local_3f0._64_8_;
                  puVar1 = (uint32_t *)(local_3f0._88_8_ + (ulong)local_484.num_words);
                  if ((ulong)local_3f0._72_8_ < puVar1) {
                    sVar11 = (spv_operand_type_t)local_460._24_8_;
                    OVar12 = local_488;
LAB_00623908:
                    OVar10 = anon_unknown.dwarf_2a62de0::Parser::exhaustedInputDiagnostic
                                       ((Parser *)local_3f0,(size_t)inst_offset,OVar12,sVar11);
                  }
                  else {
                    if (((bool)local_3f0[0x6c] == true) && ((ulong)local_484.num_words != 0)) {
                      lVar28 = local_3f0._88_8_ * 4;
                      uVar29 = (ulong)local_484.num_words;
                      lVar38 = 0;
                      do {
                        local_208._0_4_ = spvFixWord(*(uint32_t *)(uVar18 + lVar38 + lVar28),endian)
                        ;
                        if (local_2c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_2c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_2c0,
                                     (iterator)
                                     local_2c0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_208);
                        }
                        else {
                          *local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_208._0_4_;
                          local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_2c0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        lVar38 = lVar38 + 4;
                      } while (uVar29 * 4 != lVar38);
                    }
                    OVar10 = OpNop;
                    parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
                    inst_offset = local_498;
                    local_3f0._88_8_ = puVar1;
                  }
LAB_00624299:
                  bVar8 = OVar10 == OpNop;
                  OVar12 = local_460._16_4_;
                  if (!bVar8) {
                    OVar12 = OVar10;
                  }
LAB_006242a7:
                  user_data = (void *)(ulong)OVar12;
                } while (bVar8);
              }
              goto LAB_006235ec;
            }
            OVar10 = OpNop;
            if (local_3f0._88_8_ != local_3f0._72_8_) {
              __assert_fail("_.word_index == _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/binary.cpp"
                            ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
            }
            goto LAB_00623322;
          }
          OVar10 = (*(code *)local_3f0._48_8_)
                             ((void *)local_3f0._40_8_,local_3f0._104_4_,local_238.magic,
                              local_238.version,local_238.generator,local_238.bound,local_238.schema
                             );
          parsed_header = (spv_parsed_header_fn_t)(ulong)OVar10;
          if (OVar10 == OpNop) goto LAB_0062343f;
          goto LAB_00623322;
        }
        anon_unknown.dwarf_2a62de0::Parser::diagnostic
                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INTERNAL);
        pcVar35 = "Internal error: unhandled header parse failure";
        lVar28 = 0x2e;
      }
      else {
        anon_unknown.dwarf_2a62de0::Parser::diagnostic
                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid SPIR-V magic number \'",0x1d);
        lVar28 = *(long *)(CONCAT44(local_208._4_4_,local_208._0_4_) + -0x18);
        *(uint *)(&local_208.field_0x18 + lVar28) =
             *(uint *)(&local_208.field_0x18 + lVar28) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar35 = "\'.";
        lVar28 = 2;
      }
      goto LAB_00623296;
    }
    anon_unknown.dwarf_2a62de0::Parser::diagnostic
              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Module has incomplete header: only ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," words instead of ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
  }
  spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
  OVar10 = local_208.error_;
LAB_00623322:
  anon_unknown.dwarf_2a62de0::Parser::State::State
            ((State *)&local_208,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_2a62de0::Parser::State::operator=
            ((State *)(local_3f0 + 0x40),(State *)&local_208);
  anon_unknown.dwarf_2a62de0::Parser::State::~State((State *)&local_208);
  anon_unknown.dwarf_2a62de0::Parser::State::~State((State *)(local_3f0 + 0x40));
  if (local_278.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_278.consumer,(_Any_data *)&local_278.consumer,__destroy_functor);
  }
  return OVar10;
LAB_00624afb:
  do {
    p_Var5 = (__node_ptr)((_Hash_node_base *)&(_Var27._M_nxt)->_M_nxt)->_M_nxt;
    uVar31 = (ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                             *)(_Var27._M_nxt + 1))->
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                          )._M_storage._M_storage.__align % __n;
    if (__s[uVar31] == (_Hash_node_base *)0x0) {
      ((_Hash_node_base *)&(_Var27._M_nxt)->_M_nxt)->_M_nxt = local_348._M_before_begin._M_nxt;
      __s[uVar31] = &local_348._M_before_begin;
      local_348._M_before_begin._M_nxt = _Var27._M_nxt;
      if (((_Hash_node_base *)&(_Var27._M_nxt)->_M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
        pp_Var25 = __s + uVar30;
        goto LAB_00624b51;
      }
    }
    else {
      ((_Hash_node_base *)&(_Var27._M_nxt)->_M_nxt)->_M_nxt = __s[uVar31]->_M_nxt;
      pp_Var25 = &__s[uVar31]->_M_nxt;
      uVar31 = uVar30;
LAB_00624b51:
      *pp_Var25 = _Var27._M_nxt;
    }
    _Var27._M_nxt = (_Hash_node_base *)p_Var5;
    uVar30 = uVar31;
  } while (p_Var5 != (__node_ptr)0x0);
LAB_00624b5f:
  if (&local_348._M_single_bucket != local_348._M_buckets) {
    operator_delete(local_348._M_buckets,local_348._M_bucket_count << 3);
  }
  uVar30 = uVar29 % __n;
  sVar11 = local_460._24_4_;
  local_348._M_buckets = __s;
  local_348._M_bucket_count = __n;
LAB_00624ba4:
  if (local_348._M_buckets[uVar30] == (_Hash_node_base *)0x0) {
    (p_Var24->super__Hash_node_base)._M_nxt = local_348._M_before_begin._M_nxt;
    if ((__node_ptr)local_348._M_before_begin._M_nxt != (__node_ptr)0x0) {
      local_348._M_buckets
      [(ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                       *)(local_348._M_before_begin._M_nxt + 1))->
                    super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                    )._M_storage._M_storage.__align % local_348._M_bucket_count] =
           (__node_base_ptr)p_Var24;
    }
    local_348._M_buckets[uVar30] = &local_348._M_before_begin;
    local_348._M_before_begin._M_nxt = (_Hash_node_base *)p_Var24;
  }
  else {
    (p_Var24->super__Hash_node_base)._M_nxt = local_348._M_buckets[uVar30]->_M_nxt;
    local_348._M_buckets[uVar30]->_M_nxt = (_Hash_node_base *)p_Var24;
  }
  parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
  local_348._M_element_count = local_348._M_element_count + 1;
LAB_00624c27:
  *(int *)((long)&(p_Var24->
                  super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                  ._M_storage._M_storage + 4) = iVar34;
  *(spv_operand_type_t *)
   ((long)&(p_Var24->
           super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
           ._M_storage._M_storage + 8) = sVar11;
  inst_offset = local_498;
LAB_00624c3b:
  local_428.words =
       local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((bool)local_3f0[0x6c] == false) {
    local_428.words = (uint *)(local_3f0._64_8_ + inst_offset * 4);
  }
  sVar9 = local_460._16_4_;
  local_428.num_words = local_49a;
  local_428.operands = local_2d8;
  local_428.num_operands = (uint16_t)((uint)((int)local_2d0._M_current - (int)local_2d8) >> 4);
  if ((spv_parsed_instruction_fn_t)local_3f0._56_8_ != (spv_parsed_instruction_fn_t)0x0) {
    sVar16 = (*(code *)local_3f0._56_8_)((void *)local_3f0._40_8_,&local_428);
    if (sVar16 != SPV_SUCCESS) {
      sVar9 = sVar16;
    }
    user_data = (void *)(ulong)(uint)sVar9;
    if (sVar16 != SPV_SUCCESS) goto LAB_006235ec;
  }
  user_data = (spv_parsed_header_fn_t)0x0;
LAB_006235ec:
  bVar8 = (int)user_data != 0;
  parsed_header = (spv_parsed_header_fn_t)((ulong)parsed_header & 0xffffffff);
  if (bVar8) {
    parsed_header = (spv_parsed_header_fn_t)user_data;
  }
  OVar10 = (Op)parsed_header;
  if (bVar8) goto LAB_00623322;
  goto LAB_00623462;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}